

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IXWebSocketHandshake.cpp
# Opt level: O2

string * __thiscall
ix::WebSocketHandshake::genRandomString_abi_cxx11_
          (string *__return_storage_ptr__,WebSocketHandshake *this,int len)

{
  result_type_conflict1 rVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  uniform_int_distribution<int> dist;
  default_random_engine e1;
  string alphanum;
  random_device r;
  uniform_int_distribution<int> local_13e0;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_13d8;
  long local_13d0;
  int local_13c8;
  random_device local_13b0;
  
  ::std::__cxx11::string::string
            ((string *)&local_13d0,"0123456789ABCDEFGHabcdefgh",(allocator *)&local_13b0);
  ::std::random_device::random_device(&local_13b0);
  uVar2 = ::std::random_device::_M_getval();
  uVar4 = 0;
  iVar3 = (int)((uVar2 & 0xffffffff) % 0x7fffffff);
  local_13d8._M_x = (unsigned_long)(iVar3 + (uint)(iVar3 == 0));
  local_13e0._M_param._M_a = 0;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  local_13e0._M_param._M_b = local_13c8 + -1;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  uVar2 = (ulong)(uint)len;
  if (len < 1) {
    uVar2 = uVar4;
  }
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    rVar1 = ::std::uniform_int_distribution<int>::operator()(&local_13e0,&local_13d8);
    (__return_storage_ptr__->_M_dataplus)._M_p[uVar4] = *(char *)(local_13d0 + rVar1);
  }
  ::std::random_device::~random_device(&local_13b0);
  ::std::__cxx11::string::~string((string *)&local_13d0);
  return __return_storage_ptr__;
}

Assistant:

std::string WebSocketHandshake::genRandomString(const int len)
    {
        std::string alphanum =
            "0123456789"
            "ABCDEFGH"
            "abcdefgh";

        std::random_device r;
        std::default_random_engine e1(r());
        std::uniform_int_distribution<int> dist(0, (int) alphanum.size() - 1);

        std::string s;
        s.resize(len);

        for (int i = 0; i < len; ++i)
        {
            int x = dist(e1);
            s[i] = alphanum[x];
        }

        return s;
    }